

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fmt::v5::internal::udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125>::
operator()(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,udl_formatter<char,(char)123,(char)48,(char)58,(char)49,(char)48,(char)125> *this,
          int *args)

{
  size_t sVar1;
  format_string_checker<char,_fmt::v5::internal::error_handler,_int> *in_RCX;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  char s [7];
  undefined4 local_260;
  undefined3 uStack_25c;
  ulong local_258 [3];
  undefined **local_240;
  internal *local_238;
  long local_230;
  ulong local_228;
  code *local_220 [63];
  
  uStack_25c = 0x7d30;
  local_260 = 0x313a307b;
  local_240 = (undefined **)CONCAT44(local_240._4_4_,0xffffffff);
  local_230 = 6;
  local_228 = local_228 & 0xffffffff00000000;
  local_220[0] = 
  parse_format_specs<int,fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>;
  format_str.size_ = (size_t)&local_240;
  format_str.data_ = (char *)0x6;
  local_238 = (internal *)&local_260;
  parse_format_string<true,char,fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler,int>&>
            ((internal *)&local_260,format_str,in_RCX);
  sVar1 = strlen((char *)&local_260);
  local_258[0] = (ulong)(uint)*args;
  local_230 = 0;
  local_240 = &PTR_grow_002a3c18;
  local_228 = 500;
  format_str_00.size_ = sVar1;
  format_str_00.data_ = (char *)&local_260;
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)local_258;
  args_00.types_ =
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_238 = (internal *)local_220;
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_240,format_str_00,args_00,(locale_ref)0x0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_238,local_230 + (long)local_238);
  local_240 = &PTR_grow_002a3c18;
  if (local_238 != (internal *)local_220) {
    operator_delete(local_238);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<Char> operator()(const Args &... args) const {
    FMT_CONSTEXPR_DECL Char s[] = {CHARS..., '\0'};
    FMT_CONSTEXPR_DECL bool invalid_format =
        do_check_format_string<Char, error_handler, Args...>(
          basic_string_view<Char>(s, sizeof...(CHARS)));
    (void)invalid_format;
    return format(s, args...);
  }